

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_mac_ctrl_str(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  int iVar1;
  size_t sVar2;
  void *ptr;
  ASN1_OBJECT *a;
  gost_cipher_info *pgVar3;
  char *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  gost_cipher_info *param;
  ASN1_OBJECT *obj;
  long size;
  char *endptr;
  uchar *keybuf;
  int ret;
  long keylen;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  char *local_40;
  ASN1_OBJECT *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  iVar1 = strcmp((char *)in_RSI,"key");
  if (iVar1 == 0) {
    sVar2 = strlen(in_RDX);
    if (sVar2 == 0x20) {
      local_4 = pkey_gost_mac_ctrl(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                                   in_stack_ffffffffffffffd8);
    }
    else {
      ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8,0);
      local_4 = 0;
    }
  }
  else {
    iVar1 = strcmp((char *)in_RSI,"hexkey");
    if (iVar1 == 0) {
      ptr = (void *)OPENSSL_hexstr2buf(in_RDX,&stack0xffffffffffffffd8);
      if ((ptr == (void *)0x0) || (in_stack_ffffffffffffffd8 != (void *)0x20)) {
        ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                       (int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
        CRYPTO_free(ptr);
        local_4 = 0;
      }
      else {
        local_4 = pkey_gost_mac_ctrl(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,(void *)0x20);
        CRYPTO_free(ptr);
      }
    }
    else {
      iVar1 = strcmp((char *)in_RSI,"size");
      if (iVar1 == 0) {
        strtol(in_RDX,&local_40,10);
        if (*local_40 == '\0') {
          local_4 = pkey_gost_mac_ctrl(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                                       in_stack_ffffffffffffffd8);
        }
        else {
          ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                         (int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
          local_4 = 0;
        }
      }
      else {
        iVar1 = strcmp((char *)in_RSI,"paramset");
        if (iVar1 == 0) {
          a = OBJ_txt2obj(in_RDX,0);
          if (a == (ASN1_OBJECT *)0x0) {
            ERR_GOST_error(0,0,(char *)0x0,0);
            local_4 = 0;
          }
          else {
            pgVar3 = get_encryption_params(in_stack_ffffffffffffffc8);
            ASN1_OBJECT_free(a);
            if (pgVar3 == (gost_cipher_info *)0x0) {
              ERR_GOST_error((int)((ulong)a >> 0x20),(int)a,(char *)0x0,0);
              local_4 = 0;
            }
            else {
              local_4 = pkey_gost_mac_ctrl(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                                           in_stack_ffffffffffffffd8);
            }
          }
        }
        else {
          local_4 = -2;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int pkey_gost_mac_ctrl_str(EVP_PKEY_CTX *ctx,
                                  const char *type, const char *value)
{
    if (strcmp(type, key_ctrl_string) == 0) {
        if (strlen(value) != 32) {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR,
                    GOST_R_INVALID_MAC_KEY_LENGTH);
            return 0;
        }
        return pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_SET_MAC_KEY,
                                  32, (char *)value);
    }
    if (strcmp(type, hexkey_ctrl_string) == 0) {
        long keylen;
        int ret;
        unsigned char *keybuf = string_to_hex(value, &keylen);
        if (!keybuf || keylen != 32) {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR,
                    GOST_R_INVALID_MAC_KEY_LENGTH);
            OPENSSL_free(keybuf);
            return 0;
        }
        ret = pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_SET_MAC_KEY, 32, keybuf);
        OPENSSL_free(keybuf);
        return ret;

    }
    if (!strcmp(type, maclen_ctrl_string)) {
        char *endptr;
        long size = strtol(value, &endptr, 10);
        if (*endptr != '\0') {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR, GOST_R_INVALID_MAC_SIZE);
            return 0;
        }
        return pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_MAC_LEN, size, NULL);
    }
    if (strcmp(type, param_ctrl_string) == 0) {
        ASN1_OBJECT *obj = OBJ_txt2obj(value, 0);
        const struct gost_cipher_info *param = NULL;
        if (obj == NULL) {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR, GOST_R_INVALID_MAC_PARAMS);
            return 0;
        }

        param = get_encryption_params(obj);
        ASN1_OBJECT_free(obj);
        if (param == NULL) {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR, GOST_R_INVALID_MAC_PARAMS);
            return 0;
        }


        return pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_GOST_PARAMSET, 0,
                                  (void *)param);
    }
    return -2;
}